

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaQProp.cpp
# Opt level: O3

void __thiscall NaQuickProp::UpdateNN(NaQuickProp *this)

{
  undefined8 uVar1;
  uint iLayer;
  uint uVar2;
  int iVar3;
  NaNNUnit *this_00;
  NaVector *pNVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  long *plVar8;
  
  NaStdBackProp::UpdateNN
            ((NaStdBackProp *)((long)&this->_vptr_NaQuickProp + (long)this->_vptr_NaQuickProp[-5]));
  NaPrintLog("NaQuickProp::UpdateNN():\n");
  iLayer = NaNeuralNetDescr::InputLayer
                     ((NaNeuralNetDescr *)(&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]));
  uVar2 = NaNeuralNetDescr::OutputLayer
                    ((NaNeuralNetDescr *)(&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]));
  if (iLayer <= uVar2) {
    do {
      uVar2 = NaNeuralNetDescr::Inputs
                        ((NaNeuralNetDescr *)(&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]),
                         iLayer);
      if (uVar2 != 0) {
        plVar8 = (long *)(&this->field_0x8 + (ulong)iLayer * 0x18);
        uVar7 = 0;
        do {
          this_00 = NaStdBackProp::nn((NaStdBackProp *)
                                      ((long)&this->_vptr_NaQuickProp +
                                      (long)this->_vptr_NaQuickProp[-5]));
          pNVar4 = NaNNUnit::Xinp(this_00,iLayer);
          iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,uVar7);
          uVar1 = *(undefined8 *)CONCAT44(extraout_var,iVar3);
          puVar5 = (undefined8 *)(**(code **)(*plVar8 + 0x40))(plVar8,uVar7);
          *puVar5 = uVar1;
          puVar5 = (undefined8 *)(**(code **)(*plVar8 + 0x40))(plVar8,uVar7);
          NaPrintLog("             %u:%u =%g\n",*puVar5,(ulong)iLayer,uVar7);
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          uVar2 = NaNeuralNetDescr::Inputs
                            ((NaNeuralNetDescr *)
                             (&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]),iLayer);
        } while (uVar6 < uVar2);
      }
      iLayer = iLayer + 1;
      uVar2 = NaNeuralNetDescr::OutputLayer
                        ((NaNeuralNetDescr *)(&this->field_0x8 + (long)this->_vptr_NaQuickProp[-5]))
      ;
    } while (iLayer <= uVar2);
  }
  return;
}

Assistant:

void    NaQuickProp::UpdateNN ()
{
    NaStdBackProp::UpdateNN();

    unsigned    iInput, /*iNeuron,*/ iLayer;

    // Store Xinp from previous step
    NaPrintLog("NaQuickProp::UpdateNN():\n");
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        for(iInput = 0; iInput < nd.Inputs(iLayer); ++iInput){
            Xinp_prev[iLayer][iInput] = nn().Xinp(iLayer)[iInput];
	    NaPrintLog("             %u:%u =%g\n",
		       iLayer, iInput, Xinp_prev[iLayer][iInput]);
        }
    }
}